

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O1

int bn_cmp_part_words(unsigned_long *a,unsigned_long *b,int cl,int dl)

{
  int iVar1;
  long lVar2;
  
  if (dl < 0) {
    lVar2 = -(long)dl;
    do {
      if (b[(cl + -1) + lVar2] != 0) {
        return -1;
      }
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  if (0 < dl) {
    lVar2 = (ulong)(uint)dl + 1;
    do {
      if (a[(long)(cl + -1) + lVar2 + -1] != 0) {
        return 1;
      }
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  iVar1 = bn_cmp_words(a,b,cl);
  return iVar1;
}

Assistant:

int bn_cmp_part_words(const BN_ULONG *a, const BN_ULONG *b, int cl, int dl)
{
    int n, i;
    n = cl - 1;

    if (dl < 0) {
        for (i = dl; i < 0; i++) {
            if (b[n - i] != 0)
                return -1;      /* a < b */
        }
    }
    if (dl > 0) {
        for (i = dl; i > 0; i--) {
            if (a[n + i] != 0)
                return 1;       /* a > b */
        }
    }
    return bn_cmp_words(a, b, cl);
}